

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase317::run(TestCase317 *this)

{
  ArrayPtr<kj::String> argValues;
  int iVar1;
  Bar **params;
  Bar **params_00;
  long lVar2;
  undefined1 auVar3 [16];
  String *in_stack_ffffffffffffff68;
  Bar *pBVar4;
  Bar *m;
  Bar bar;
  Fault f;
  String local_60;
  String local_48;
  
  pBVar4 = &bar;
  bar.super_Foo._vptr_Foo = (Foo)&PTR__Foo_001c5460;
  auVar3 = __dynamic_cast(pBVar4,&(anonymous_namespace)::Foo::typeinfo,
                          &(anonymous_namespace)::Bar::typeinfo);
  m = auVar3._0_8_;
  if (m == (Bar *)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
               ,0x14d,FAILED,(char *)0x0,"\"Dynamic downcast returned null.\"",
               (char (*) [32])"Dynamic downcast returned null.");
    _::Debug::Fault::fatal(&f);
  }
  if (_::Debug::minSeverity < 3 && pBVar4 != m) {
    str<char_const(&)[31]>((String *)&f,(kj *)"failed: expected (&bar) == (m)",auVar3._8_8_);
    str<kj::(anonymous_namespace)::Bar*&>(&local_60,(kj *)&stack0xffffffffffffff70,params);
    str<kj::(anonymous_namespace)::Bar*&>(&local_48,(kj *)&m,params_00);
    argValues.size_ = (size_t)pBVar4;
    argValues.ptr = in_stack_ffffffffffffff68;
    _::Debug::logInternal
              ((Debug *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
               ,(char *)0x14b,2,0x186135,(char *)&f,argValues);
    lVar2 = 0x30;
    do {
      Array<char>::~Array((Array<char> *)((long)&f.exception + lVar2));
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != -0x18);
  }
  iVar1 = _::Debug::minSeverity;
  lVar2 = __dynamic_cast(&bar,&(anonymous_namespace)::Foo::typeinfo,
                         &(anonymous_namespace)::Baz::typeinfo,0);
  if ((lVar2 != 0) && (iVar1 < 3)) {
    _::Debug::log<char_const(&)[65]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/common-test.c++"
               ,0x14f,ERROR,
               "\"failed: expected \" \"dynamicDowncastIfAvailable<Baz>(foo) == nullptr\"",
               (char (*) [65])"failed: expected dynamicDowncastIfAvailable<Baz>(foo) == nullptr");
  }
  return;
}

Assistant:

virtual ~Bar() {}